

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O0

int __thiscall RSTARPlanner::SetSearchStartState(RSTARPlanner *this,int SearchStartStateID)

{
  CMDPSTATE *pCVar1;
  long in_RDI;
  CMDPSTATE *MDPstate;
  int in_stack_000001f4;
  RSTARPlanner *in_stack_000001f8;
  
  pCVar1 = GetState(in_stack_000001f8,in_stack_000001f4);
  if (pCVar1 != *(CMDPSTATE **)(*(long *)(in_RDI + 0x38) + 0x28)) {
    *(CMDPSTATE **)(*(long *)(in_RDI + 0x38) + 0x28) = pCVar1;
    *(undefined1 *)(*(long *)(in_RDI + 0x38) + 0x49) = 1;
    *(undefined8 *)(*(long *)(in_RDI + 0x38) + 8) = 0x41cdcd6500000000;
  }
  return 1;
}

Assistant:

int RSTARPlanner::SetSearchStartState(int SearchStartStateID)
{
    CMDPSTATE* MDPstate = GetState(SearchStartStateID);

    if (MDPstate != pSearchStateSpace->searchstartstate) {
        pSearchStateSpace->searchstartstate = MDPstate;
        pSearchStateSpace->bReinitializeSearchStateSpace = true;
        pSearchStateSpace->eps_satisfied = INFINITECOST;
    }

    return 1;
}